

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans.h
# Opt level: O0

int __thiscall draco::RAnsDecoder<18>::rans_read(RAnsDecoder<18> *this)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  uint32_t uVar5;
  rans_dec_sym *in_RDI;
  rans_dec_sym sym;
  uint quo;
  uint rem;
  uint in_stack_ffffffffffffffd4;
  uint32_t rem_00;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int local_18;
  int local_14;
  
  while( true ) {
    rem_00 = in_stack_ffffffffffffffd4 & 0xffffff;
    if (in_RDI[5].val < 0x100000) {
      rem_00 = CONCAT13(0 < (int)in_RDI[4].cum_prob,(int3)in_stack_ffffffffffffffd4);
    }
    if ((char)(rem_00 >> 0x18) == '\0') break;
    uVar1 = in_RDI[5].val;
    lVar4 = *(long *)(in_RDI + 4);
    uVar5 = in_RDI[4].cum_prob - 1;
    in_RDI[4].cum_prob = uVar5;
    in_RDI[5].val = uVar1 * 0x100 + (uint)*(byte *)(lVar4 + (int)uVar5);
    in_stack_ffffffffffffffd4 = rem_00;
  }
  uVar2 = in_RDI[5].val;
  uVar3 = in_RDI[5].val;
  fetch_sym((RAnsDecoder<18> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_RDI,
            rem_00);
  in_RDI[5].val = ((uVar2 >> 0x12) * local_18 + (uVar3 & 0x3ffff)) - local_14;
  return in_stack_ffffffffffffffe4;
}

Assistant:

inline int rans_read() {
    unsigned rem;
    unsigned quo;
    struct rans_dec_sym sym;
    while (ans_.state < l_rans_base && ans_.buf_offset > 0) {
      ans_.state = ans_.state * DRACO_ANS_IO_BASE + ans_.buf[--ans_.buf_offset];
    }
    // |rans_precision| is a power of two compile time constant, and the below
    // division and modulo are going to be optimized by the compiler.
    quo = ans_.state / rans_precision;
    rem = ans_.state % rans_precision;
    fetch_sym(&sym, rem);
    ans_.state = quo * sym.prob + rem - sym.cum_prob;
    return sym.val;
  }